

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementCableANCF::ShapeFunctions(ChElementCableANCF *this,ShapeVector *N,double xi)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 extraout_var [56];
  
  dVar1 = (this->super_ChElementBeam).length;
  dVar3 = xi * xi;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar3;
  auVar4 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar6,ZEXT816(0x3ff0000000000000));
  auVar10._0_8_ = auVar4._0_8_;
  auVar9._0_8_ = pow(xi,3.0);
  auVar9._8_56_ = extraout_var;
  auVar10._8_8_ = 0;
  auVar4 = vfmadd132sd_fma(auVar9._0_16_,auVar10,ZEXT816(0x4000000000000000));
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[0] =
       auVar4._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = xi;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar3;
  auVar4 = vfmadd132sd_fma(ZEXT816(0xc000000000000000),auVar7,auVar4);
  dVar5 = pow(xi,3.0);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[1] =
       (dVar5 + auVar4._0_8_) * dVar1;
  dVar5 = pow(xi,3.0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar3;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar5 * -2.0;
  auVar4 = vfmadd231sd_fma(auVar8,ZEXT816(0x4008000000000000),auVar2);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[2] =
       auVar4._0_8_;
  dVar5 = pow(xi,3.0);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[3] =
       (dVar5 - dVar3) * dVar1;
  return;
}

Assistant:

void ChElementCableANCF::ShapeFunctions(ShapeVector& N, double xi) {
    double l = this->GetRestLength();

    N(0) = 1 - 3 * pow(xi, 2) + 2 * pow(xi, 3);
    N(1) = l * (xi - 2 * pow(xi, 2) + pow(xi, 3));
    N(2) = 3 * pow(xi, 2) - 2 * pow(xi, 3);
    N(3) = l * (-pow(xi, 2) + pow(xi, 3));
}